

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O2

int xar_free(archive_write *a)

{
  archive_rb_tree *rbt;
  int *__ptr;
  file_conflict *pfVar1;
  archive_rb_node *self;
  archive_rb_node *paVar2;
  file_conflict *file;
  
  __ptr = (int *)a->format_data;
  if (-1 < *__ptr) {
    close(*__ptr);
  }
  archive_string_free((archive_string *)(__ptr + 10));
  archive_string_free((archive_string *)(__ptr + 0x14));
  archive_string_free((archive_string *)(__ptr + 0x1a));
  rbt = (archive_rb_tree *)(__ptr + 0x406e);
  self = __archive_rb_tree_iterate(rbt,(archive_rb_node *)0x0,0);
  while (self != (archive_rb_node *)0x0) {
    paVar2 = __archive_rb_tree_iterate(rbt,self,1);
    __archive_rb_tree_remove_node(rbt,self);
    free(self);
    self = paVar2;
  }
  file = *(file_conflict **)(__ptr + 0x406a);
  while (file != (file_conflict *)0x0) {
    pfVar1 = file->next;
    file_free(file);
    file = pfVar1;
  }
  if (__ptr[0x3e] != 0) {
    (**(code **)(__ptr + 0x44))(a,__ptr + 0x32);
  }
  free(__ptr);
  return 0;
}

Assistant:

static int
xar_free(struct archive_write *a)
{
	struct xar *xar;

	xar = (struct xar *)a->format_data;

	/* Close the temporary file. */
	if (xar->temp_fd >= 0)
		close(xar->temp_fd);

	archive_string_free(&(xar->cur_dirstr));
	archive_string_free(&(xar->tstr));
	archive_string_free(&(xar->vstr));
	file_free_hardlinks(xar);
	file_free_register(xar);
	compression_end(&(a->archive), &(xar->stream));
	free(xar);

	return (ARCHIVE_OK);
}